

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hpack.cpp
# Opt level: O1

Header * __thiscall
Hpack::decodeHTTP2Header
          (Header *__return_storage_ptr__,Hpack *this,char *receivedPayload,uint length)

{
  byte bVar1;
  byte bVar2;
  pointer pcVar3;
  ostream *poVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  string valueString;
  undefined1 local_178 [8];
  char *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  long *local_150;
  long local_148;
  long local_140 [2];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Header::Header(__return_storage_ptr__);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Header binary: ",0xf);
  if (length != 0) {
    uVar10 = 0;
    do {
      *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)&std::cout,(uint)(byte)receivedPayload[uVar10]);
      uVar10 = uVar10 + 1;
    } while (length != uVar10);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  if (length != 0) {
    uVar10 = 0;
    do {
      bVar1 = receivedPayload[uVar10];
      iVar5 = (int)uVar10;
      if ((char)bVar1 < '\0') {
        uVar8 = (bVar1 & 0x7f) - 1;
        local_178[0] = StaticTable::static_table[uVar8].index;
        local_170 = local_168._M_local_buf + 8;
        pcVar3 = StaticTable::static_table[uVar8].header_name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar3,
                   pcVar3 + StaticTable::static_table[uVar8].header_name._M_string_length);
        local_150 = local_140;
        pcVar3 = StaticTable::static_table[uVar8].header_value._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,pcVar3,
                   pcVar3 + StaticTable::static_table[uVar8].header_value._M_string_length);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_170,local_170 + local_168._M_allocated_capacity);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_150,local_148 + (long)local_150);
        Header::setHeaderline(__return_storage_ptr__,&local_d0,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
        std::ostream::put('`');
        poVar4 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"Indexed Header Field Representation, index: ",0x2c);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,", at: ",6);
        uVar10 = (ulong)(iVar5 + 1);
        *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
             *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        if (local_150 != local_140) {
          operator_delete(local_150,local_140[0] + 1);
        }
        if (local_170 != local_168._M_local_buf + 8) {
          operator_delete(local_170,local_168._8_8_ + 1);
        }
      }
      else {
        if (bVar1 < 0x40) {
          if ((bVar1 & 0x30) == 0x10) {
            bVar2 = receivedPayload[iVar5 + 1];
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
            std::ostream::put('`');
            poVar4 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"Literal Header Field Never Indexed, index: ",0x2b);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", at: ",6);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", length: ",10);
            uVar8 = bVar2 & 0x7f;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", huffman: ",0xb);
            poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
            pcVar7 = ", binary: ";
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", binary: ",10);
            if ((char)uVar8 != '\0') {
              uVar10 = 0;
              do {
                *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
                     *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
                uVar6 = (byte)(receivedPayload + (iVar5 + 2))[uVar10] & 0xf;
                pcVar7 = (char *)(ulong)uVar6;
                std::ostream::operator<<((ostream *)&std::cout,uVar6);
                uVar10 = uVar10 + 1;
              } while (uVar8 != uVar10);
            }
            handeBinary_abi_cxx11_
                      ((string *)local_178,(Hpack *)pcVar7,receivedPayload + (iVar5 + 2),uVar8,
                       (bool)(bVar2 >> 7));
            uVar6 = (bVar1 & 0xf) - 1;
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            pcVar3 = StaticTable::static_table[uVar6].header_name._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_130,pcVar3,
                       pcVar3 + StaticTable::static_table[uVar6].header_name._M_string_length);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,CONCAT71(local_178._1_7_,local_178[0]),
                       local_170 + CONCAT71(local_178._1_7_,local_178[0]));
            Header::setHeaderline(__return_storage_ptr__,&local_130,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", name: ",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)CONCAT71(local_178._1_7_,local_178[0]),
                       (long)local_170);
          }
          else {
            if ((bVar1 & 0x30) != 0) {
              if (0x1f < bVar1) {
                iVar5 = iVar5 + -2;
                do {
                  iVar9 = iVar5;
                  iVar5 = iVar9 + 1;
                } while (receivedPayload[iVar9 + 3] < '\0');
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
                std::ostream::put('`');
                poVar4 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar4,"Dynamic Table Size Update, newSize: ",0x24);
                *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                     *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", at: ",6);
                *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                     *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
                std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                uVar10 = (ulong)(iVar9 + 4);
              }
              goto LAB_0012ebae;
            }
            bVar2 = receivedPayload[iVar5 + 1];
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
            std::ostream::put('`');
            poVar4 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar4,"Literal Header Field without Indexing: ",0x27);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", at: ",6);
            *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                 *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", length: ",10);
            uVar8 = bVar2 & 0x7f;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", huffman: ",0xb);
            poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
            pcVar7 = ", binary: ";
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", binary: ",10);
            if ((char)uVar8 != '\0') {
              uVar10 = 0;
              do {
                *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
                     *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
                uVar6 = (byte)(receivedPayload + (iVar5 + 2))[uVar10] & 0xf;
                pcVar7 = (char *)(ulong)uVar6;
                std::ostream::operator<<((ostream *)&std::cout,uVar6);
                uVar10 = uVar10 + 1;
              } while (uVar8 != uVar10);
            }
            handeBinary_abi_cxx11_
                      ((string *)local_178,(Hpack *)pcVar7,receivedPayload + (iVar5 + 2),uVar8,
                       (bool)(bVar2 >> 7));
            uVar6 = (bVar1 & 0xf) - 1;
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            pcVar3 = StaticTable::static_table[uVar6].header_name._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,pcVar3,
                       pcVar3 + StaticTable::static_table[uVar6].header_name._M_string_length);
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,CONCAT71(local_178._1_7_,local_178[0]),
                       local_170 + CONCAT71(local_178._1_7_,local_178[0]));
            Header::setHeaderline(__return_storage_ptr__,&local_110,&local_90);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p != &local_90.field_2) {
              operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", name: ",8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)CONCAT71(local_178._1_7_,local_178[0]),
                       (long)local_170);
          }
        }
        else {
          bVar2 = receivedPayload[iVar5 + 1];
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
          std::ostream::put('`');
          poVar4 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,"Literal Header Field with Incremental Indexing, index: ",0x37);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", at: ",6);
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", length: ",10);
          uVar8 = bVar2 & 0x7f;
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", huffman: ",0xb);
          poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
          pcVar7 = ", binary: ";
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", binary: ",10);
          if ((char)uVar8 != '\0') {
            uVar10 = 0;
            do {
              *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
              uVar6 = (byte)(receivedPayload + (iVar5 + 2))[uVar10] & 0xf;
              pcVar7 = (char *)(ulong)uVar6;
              std::ostream::operator<<((ostream *)&std::cout,uVar6);
              uVar10 = uVar10 + 1;
            } while (uVar8 != uVar10);
          }
          handeBinary_abi_cxx11_
                    ((string *)local_178,(Hpack *)pcVar7,receivedPayload + (iVar5 + 2),uVar8,
                     (bool)(bVar2 >> 7));
          uVar6 = (bVar1 & 0x3f) - 1;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          pcVar3 = StaticTable::static_table[uVar6].header_name._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,pcVar3,
                     pcVar3 + StaticTable::static_table[uVar6].header_name._M_string_length);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,CONCAT71(local_178._1_7_,local_178[0]),
                     local_170 + CONCAT71(local_178._1_7_,local_178[0]));
          Header::setHeaderline(__return_storage_ptr__,&local_f0,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", name: ",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)CONCAT71(local_178._1_7_,local_178[0]),
                     (long)local_170);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_178._1_7_,local_178[0]) != &local_168) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_178._1_7_,local_178[0]),
                          local_168._M_allocated_capacity + 1);
        }
        uVar10 = (ulong)(iVar5 + uVar8 + 2);
      }
LAB_0012ebae:
    } while ((uint)uVar10 < length);
  }
  return __return_storage_ptr__;
}

Assistant:

Header Hpack::decodeHTTP2Header(char *receivedPayload, unsigned int length) {
  Header header;
  unsigned int iterator = 0;
  
  //prints out compressed header start
  std::cout << std::endl << "Header binary: ";
  for (unsigned int i = 0; i < length;i++) {std::cout << std::hex << ((int)receivedPayload[i] & 0xFF);}
  std::cout << std::endl;
  //prints out compressed header end
  
  while (iterator < length) {
    
    //Indexed Header Field Representation
    if ((receivedPayload[iterator] & 0x80) >> 7) {
      unsigned int index = receivedPayload[iterator++] & 0x7F;
      
      StaticTableLine line = StaticTable::static_table[index - 1];
      header.setHeaderline(line.header_name, line.header_value);
      
      std::cout << std::endl << "Indexed Header Field Representation, index: " << index << ", at: "  << std::dec << iterator;
    }
    
    //Literal Header Field with Incremental Indexing
    else if ((receivedPayload[iterator] & 0xC0) == 0x40) {
      unsigned int index = receivedPayload[iterator++] & 0x3F, nameLength;
      bool huffman = (receivedPayload[iterator] & 0x80) >> 7;
      nameLength = receivedPayload[iterator++] & 0x7F;
      
      char * stringData = &receivedPayload[iterator];
      iterator += nameLength;
      
      std::cout << std::endl << "Literal Header Field with Incremental Indexing, index: " << index << ", at: " << std::dec << iterator - nameLength << ", length: " << nameLength << ", huffman: " << huffman << ", binary: ";
      for (size_t j = 0; j < nameLength;j++) {
        std::cout << std::hex << ((int)stringData[j] & 0x0F);
      }
      
      std::string valueString(handeBinary(stringData, nameLength, huffman));
      header.setHeaderline(StaticTable::static_table[index - 1].header_name, valueString);
      
      std::cout << ", name: " << valueString;
    }
    
    //Literal Header Field without Indexing
    else if ((receivedPayload[iterator] & 0xF0) == 0x00) {
      unsigned int index = receivedPayload[iterator++] & 0x0F, nameLength;
      bool huffman = (receivedPayload[iterator] & 0x80) >> 7;
      nameLength = receivedPayload[iterator++] & 0x7F;
      
      char * stringData = &receivedPayload[iterator];
      iterator += nameLength;
      
      std::cout << std::endl << "Literal Header Field without Indexing: " << index << ", at: "  << std::dec << iterator  - nameLength << ", length: " << nameLength << ", huffman: " << huffman << ", binary: ";
      for (size_t j = 0; j < nameLength;j++) {
        std::cout << std::hex << ((int)stringData[j] & 0x0F);
      }
      
      std::string valueString(handeBinary(stringData, nameLength, huffman));
      header.setHeaderline(StaticTable::static_table[index - 1].header_name, valueString);
      
      std::cout << ", name: " << valueString;
    }
    
    //Literal Header Field Never Indexed
    else if ((receivedPayload[iterator] & 0xF0) == 0x10) {
      unsigned int index = receivedPayload[iterator++] & 0x0F, nameLength;
      bool huffman = (receivedPayload[iterator] & 0x80) >> 7;
      nameLength = receivedPayload[iterator++] & 0x7F;
      
      char *stringData = &receivedPayload[iterator];
      iterator += nameLength;
      
      std::cout << std::endl << "Literal Header Field Never Indexed, index: " << index << ", at: "  << std::dec << iterator - nameLength << ", length: " << nameLength << ", huffman: " << huffman << ", binary: ";
      
      for (size_t j = 0; j < nameLength;j++) {
        std::cout << std::hex << ((int)stringData[j] & 0x0F);
      }
      if (huffman) {
        //Huffman::decode(stringData, nameLength);
      }
      
      std::string valueString(handeBinary(stringData, nameLength, huffman));
      header.setHeaderline(StaticTable::static_table[index - 1].header_name, valueString);
      
      std::cout << ", name: " << valueString;
    }
    
    //Dynamic Table Size Update
    else if ((receivedPayload[iterator] & 0xE0) == 0x20) {
      unsigned int dynamicTableSizeUpdate = receivedPayload[iterator++] & 0x1F, m = 0;
      
      bool continuation = true;
      while (continuation) {
        dynamicTableSizeUpdate += (receivedPayload[iterator] & 0x7F) << m;
        m += 7;
        continuation = (receivedPayload[iterator++] & 0x80) >> 7;
      }
      
      std::cout << std::endl << "Dynamic Table Size Update, newSize: " << std::dec << dynamicTableSizeUpdate << ", at: "  << std::dec << iterator - 3;
      
      /*
      decode I from the next N bits
      if I < 2^N - 1, return I
      else
          M = 0
          repeat
              B = next octet
              I = I + (B & 127) * 2^M
              M = M + 7
          while B & 128 == 128
          return I
       */
      
    }
  }
  
  return header;
}